

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

uint32_t lys_module_pos(lys_module *module)

{
  ly_ctx *ctx;
  long lVar1;
  long lVar2;
  
  ctx = module->ctx;
  lVar1 = (long)(ctx->models).used;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((ctx->models).list[lVar2] == module) {
        return (int)lVar2 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
         ,0x12d1);
  return 0;
}

Assistant:

static uint32_t
lys_module_pos(struct lys_module *module)
{
    int i;
    uint32_t pos = 1;

    for (i = 0; i < module->ctx->models.used; ++i) {
        if (module->ctx->models.list[i] == module) {
            return pos;
        }
        ++pos;
    }

    LOGINT(module->ctx);
    return 0;
}